

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmosSyncChannel_Mixer.cpp
# Opt level: O2

AtmosSyncChannelMixer * __thiscall ASDCP::AtmosSyncChannelMixer::Reset(AtmosSyncChannelMixer *this)

{
  undefined8 *puVar1;
  long in_RSI;
  undefined8 *puVar2;
  Result_t aRStack_88 [104];
  
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  puVar2 = *(undefined8 **)(in_RSI + 8);
  puVar1 = *(undefined8 **)(in_RSI + 0x10);
  while ((puVar2 != puVar1 && (-1 < *(int *)&this->_vptr_AtmosSyncChannelMixer))) {
    (**(code **)(*(long *)*puVar2 + 0x28))(aRStack_88);
    Kumu::Result_t::operator=((Result_t *)this,aRStack_88);
    Kumu::Result_t::~Result_t(aRStack_88);
    puVar2 = puVar2 + 1;
  }
  return this;
}

Assistant:

Result_t
ASDCP::AtmosSyncChannelMixer::Reset()
{
  Result_t result = RESULT_OK;
  SourceList::iterator it;
  SourceList::iterator lastInput = m_inputs.end();

  for ( it = m_inputs.begin(); it != lastInput && ASDCP_SUCCESS(result) ; ++it )
    result = (*it)->Reset();

  return result;
}